

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O2

void correct(double *x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *x;
  dVar2 = -1e+100;
  if ((-1e+100 <= dVar1) && (dVar2 = 1e+100, dVar1 <= 1e+100)) {
    if ((dVar1 <= 0.0) || (1e-100 <= dVar1)) {
      if (0.0 <= dVar1) {
        return;
      }
      if (dVar1 <= -1e-100) {
        return;
      }
      dVar2 = -1e-100;
    }
    else {
      dVar2 = 1e-100;
    }
  }
  *x = dVar2;
  return;
}

Assistant:

void correct(double &x) {
    if (x < -MAX_DOUBLE) {
        x = -MAX_DOUBLE;
    }
    if (x > MAX_DOUBLE) {
        x = MAX_DOUBLE;
    }
    if (x > 0 && x < MIN_ACCURACY) {
        x = MIN_ACCURACY;
    }
    if (x < 0 && x > -MIN_ACCURACY) {
        x = -MIN_ACCURACY;
    }
}